

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O3

void __thiscall QWidgetRepaintManager::~QWidgetRepaintManager(QWidgetRepaintManager *this)

{
  int *piVar1;
  QWidgetRepaintManager *this_00;
  ulong uVar2;
  
  this_00 = this;
  if (*(long *)(this + 0x28) != 0) {
    uVar2 = 0;
    do {
      resetWidget(this_00,*(QWidget **)(*(long *)(this + 0x20) + uVar2 * 8));
      uVar2 = uVar2 + 1;
    } while (uVar2 < *(ulong *)(this + 0x28));
  }
  if (*(long *)(this + 0x40) != 0) {
    uVar2 = 0;
    do {
      resetWidget(this_00,*(QWidget **)(*(long *)(this + 0x38) + uVar2 * 8));
      uVar2 = uVar2 + 1;
    } while (uVar2 < *(ulong *)(this + 0x40));
  }
  piVar1 = *(int **)(this + 0x68);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x68),8,0x10);
    }
  }
  piVar1 = *(int **)(this + 0x50);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x50),8,0x10);
    }
  }
  QRegion::~QRegion((QRegion *)(this + 0x48));
  piVar1 = *(int **)(this + 0x30);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x30),8,0x10);
    }
  }
  piVar1 = *(int **)(this + 0x18);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x18),8,0x10);
    }
  }
  QRegion::~QRegion((QRegion *)(this + 0x10));
  return;
}

Assistant:

QWidgetRepaintManager::~QWidgetRepaintManager()
{
    for (int c = 0; c < dirtyWidgets.size(); ++c)
        resetWidget(dirtyWidgets.at(c));
    for (int c = 0; c < dirtyRenderToTextureWidgets.size(); ++c)
        resetWidget(dirtyRenderToTextureWidgets.at(c));
}